

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  uint32 *puVar1;
  uint32 uVar2;
  int iVar3;
  uint uVar4;
  ScriptContext *pSVar5;
  ArrayBuffer *pAVar6;
  undefined4 extraout_var;
  
  pSVar5 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag != SnapArrayBufferObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
  pAVar6 = Js::JavascriptLibrary::CreateArrayBuffer
                     ((pSVar5->super_ScriptContextBase).javascriptLibrary,*puVar1);
  uVar2 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    (pAVar6);
  if (uVar2 == *puVar1) {
    iVar3 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pAVar6);
    uVar4 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])(pAVar6);
    js_memcpy_s((void *)CONCAT44(extraout_var,iVar3),(ulong)uVar4,*(void **)(puVar1 + 2),
                (ulong)*puVar1);
    return (RecyclableObject *)pAVar6;
  }
  TTDAbort_unrecoverable_error("Something is wrong with our sizes.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapArrayBufferInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //ArrayBuffers can change on us so seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapArrayBufferInfo* buffInfo = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(snpObject);

            Js::ArrayBuffer* abuff = ctx->GetLibrary()->CreateArrayBuffer(buffInfo->Length);
            TTDAssert(abuff->GetByteLength() == buffInfo->Length, "Something is wrong with our sizes.");

            js_memcpy_s(abuff->GetBuffer(), abuff->GetByteLength(), buffInfo->Buff, buffInfo->Length);

            return abuff;
        }